

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIScrollBar::setMax(CGUIScrollBar *this,s32 max)

{
  bool bVar1;
  CGUIScrollBar *pCVar2;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  s32 in_ESI;
  CGUIScrollBar *in_RDI;
  f32 a;
  bool enable;
  
  in_RDI->Max = in_ESI;
  pCVar2 = in_RDI;
  if (in_RDI->Max < in_RDI->Min) {
    pCVar2 = (CGUIScrollBar *)(ulong)(uint)in_RDI->Max;
    in_RDI->Min = in_RDI->Max;
  }
  a = range(in_RDI);
  bVar1 = core::isnotzero(a,1e-06);
  uVar3 = CONCAT71((int7)((ulong)pCVar2 >> 8),bVar1);
  (*(in_RDI->UpButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (in_RDI->UpButton,bVar1,extraout_RDX,uVar3);
  (*(in_RDI->DownButton->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x13])
            (in_RDI->DownButton,bVar1,extraout_RDX_00,CONCAT71((int7)((ulong)uVar3 >> 8),bVar1));
  (**(code **)(*(long *)in_RDI + 0x168))(in_RDI,in_RDI->Pos);
  return;
}

Assistant:

void CGUIScrollBar::setMax(s32 max)
{
	Max = max;
	if (Min > Max)
		Min = Max;

	bool enable = core::isnotzero(range());
	UpButton->setEnabled(enable);
	DownButton->setEnabled(enable);
	setPos(Pos);
}